

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMElementImpl::release(DOMElementImpl *this)

{
  DOMDocument *pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMException *pDVar4;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  MemoryManager *local_d0;
  DOMDocumentImpl *local_c0;
  long local_b0;
  MemoryManager *local_a0;
  DOMNode *local_90;
  MemoryManager *local_80;
  DOMDocumentImpl *local_70;
  long local_60;
  MemoryManager *local_50;
  DOMNode *attr;
  XMLSize_t count;
  DOMDocumentImpl *doc;
  DOMElementImpl *this_local;
  
  bVar2 = DOMNodeImpl::isOwned(&this->fNode);
  if ((bVar2) && (bVar2 = DOMNodeImpl::isToBeReleased(&this->fNode), !bVar2)) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMElementImpl *)0x0) {
      local_50 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        local_60 = 0;
      }
      else {
        local_60 = CONCAT44(extraout_var,iVar3) + -8;
      }
      if (local_60 == 0) {
        local_80 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar3) == 0) {
          local_70 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_70 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar3) + -8);
        }
        local_80 = DOMDocumentImpl::getMemoryManager(local_70);
      }
      local_50 = local_80;
    }
    DOMException::DOMException(pDVar4,0xf,0,local_50);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  pDVar1 = (this->fParent).fOwnerDocument;
  if (pDVar1 == (DOMDocument *)0x0) {
    local_90 = (DOMNode *)0x0;
  }
  else {
    local_90 = &pDVar1[-1].super_DOMNode;
  }
  if (local_90 == (DOMNode *)0x0) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMElementImpl *)0x0) {
      local_a0 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_03,iVar3) == 0) {
        local_b0 = 0;
      }
      else {
        local_b0 = CONCAT44(extraout_var_03,iVar3) + -8;
      }
      if (local_b0 == 0) {
        local_d0 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_04,iVar3) == 0) {
          local_c0 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_c0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_04,iVar3) + -8);
        }
        local_d0 = DOMDocumentImpl::getMemoryManager(local_c0);
      }
      local_a0 = local_d0;
    }
    DOMException::DOMException(pDVar4,0xf,0,local_a0);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_DELETED,(DOMNode *)0x0,(DOMNode *)0x0);
  DOMParentNode::release(&this->fParent);
  (*(this->fAttributes->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xd])(this->fAttributes,0);
  while( true ) {
    iVar3 = (*(this->fAttributes->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])();
    if (CONCAT44(extraout_var_01,iVar3) == 0) break;
    iVar3 = (*(this->fAttributes->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0x10])
                      (this->fAttributes,CONCAT44(extraout_var_01,iVar3) + -1);
    (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x138))();
  }
  (*local_90->_vptr_DOMNode[6])(local_90,this,6);
  return;
}

Assistant:

void DOMElementImpl::release()
{
    if (fNode.isOwned() && !fNode.isToBeReleased())
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);

    DOMDocumentImpl* doc = (DOMDocumentImpl*) fParent.fOwnerDocument;
    if (doc) {
        fNode.callUserDataHandlers(DOMUserDataHandler::NODE_DELETED, 0, 0);
        // release children
        fParent.release();
        // release attributes
        fAttributes->hasDefaults(false);
        XMLSize_t count;
        while((count = fAttributes->getLength()) != 0)
        {
            DOMNode* attr = fAttributes->removeNamedItemAt(count-1);
            attr->release();
        }

        doc->release(this, DOMMemoryManager::ELEMENT_OBJECT);
    }
    else {
        // shouldn't reach here
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);
    }
}